

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnIfExpr(BinaryReaderInterp *this,Type sig_type)

{
  bool bVar1;
  Offset fixup_offset;
  Offset fixup;
  Location local_48;
  Enum local_24;
  BinaryReaderInterp *local_20;
  BinaryReaderInterp *this_local;
  Type sig_type_local;
  
  local_20 = this;
  unique0x100000e8 = sig_type;
  GetLocation(&local_48,this);
  local_24 = (Enum)SharedValidator::OnIf(&this->validator_,&local_48,stack0xffffffffffffffec);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    Istream::Emit(this->istream_,InterpBrUnless);
    fixup_offset = Istream::EmitFixupU32(this->istream_);
    PushLabel(this,Block,0xffffffff,fixup_offset,0xffffffff);
    Result::Result((Result *)&sig_type_local,Ok);
  }
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnIfExpr(Type sig_type) {
  CHECK_RESULT(validator_.OnIf(GetLocation(), sig_type));
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  PushLabel(LabelKind::Block, Istream::kInvalidOffset, fixup);
  return Result::Ok;
}